

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compress_internal
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_parameters params)

{
  ZSTD_CCtx_params cctxParams_00;
  ZSTD_CCtx_params params_00;
  ZSTD_parameters params_01;
  undefined1 auVar1 [28];
  size_t sVar2;
  undefined8 in_stack_ffffffffffffff40;
  undefined8 uStack_b8;
  ZSTD_CCtx_params cctxParams;
  void *dict_local;
  size_t srcSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_CCtx *cctx_local;
  
  cctxParams_00.customMem.opaque = (void *)params.cParams._0_8_;
  cctxParams_00._0_120_ = *(undefined1 (*) [120])&(cctx->requestedParams).cParams.chainLog;
  params_01.fParams._4_8_ = in_stack_ffffffffffffff40;
  auVar1 = SUB3228(params._8_32_,0);
  params_01.cParams.windowLog = auVar1._0_4_;
  params_01.cParams.chainLog = auVar1._4_4_;
  params_01.cParams.hashLog = auVar1._8_4_;
  params_01.cParams.searchLog = auVar1._12_4_;
  params_01.cParams.minMatch = auVar1._16_4_;
  params_01.cParams.targetLength = auVar1._20_4_;
  params_01.cParams.strategy = auVar1._24_4_;
  params_01.fParams.contentSizeFlag = SUB324(params._8_32_,0x1c);
  ZSTD_assignParamsToCCtxParams(cctxParams_00,params_01);
  params_00.cParams._4_8_ = cctxParams._0_8_;
  params_00._0_8_ = uStack_b8;
  params_00.cParams._12_8_ = cctxParams.cParams._4_8_;
  params_00.cParams._20_8_ = cctxParams.cParams._12_8_;
  params_00.fParams._0_8_ = cctxParams.cParams._20_8_;
  params_00._40_8_ = cctxParams.fParams._0_8_;
  params_00._48_8_ = cctxParams._40_8_;
  params_00._56_8_ = cctxParams._48_8_;
  params_00.jobSize = cctxParams._56_8_;
  params_00._72_8_ = cctxParams.jobSize;
  params_00.ldmParams._0_8_ = cctxParams._72_8_;
  params_00.ldmParams._8_8_ = cctxParams.ldmParams._0_8_;
  params_00.ldmParams._16_8_ = cctxParams.ldmParams._8_8_;
  params_00.customMem.customAlloc = (ZSTD_allocFunction)cctxParams.ldmParams._16_8_;
  params_00.customMem.customFree = (ZSTD_freeFunction)cctxParams.customMem.customAlloc;
  params_00.customMem.opaque = cctxParams.customMem.customFree;
  sVar2 = ZSTD_compress_advanced_internal(cctx,dst,dstCapacity,src,srcSize,dict,dictSize,params_00);
  return sVar2;
}

Assistant:

static size_t ZSTD_compress_internal (ZSTD_CCtx* cctx,
                                      void* dst, size_t dstCapacity,
                                const void* src, size_t srcSize,
                                const void* dict,size_t dictSize,
                                      ZSTD_parameters params)
{
    ZSTD_CCtx_params const cctxParams =
            ZSTD_assignParamsToCCtxParams(cctx->requestedParams, params);
    DEBUGLOG(4, "ZSTD_compress_internal");
    return ZSTD_compress_advanced_internal(cctx,
                                           dst, dstCapacity,
                                           src, srcSize,
                                           dict, dictSize,
                                           cctxParams);
}